

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_trie.c
# Opt level: O1

int trie_node_append_cb_iterator(trie t,trie_key key,trie_value value,trie_cb_iterate_args args)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(t == (trie)0x0);
  auVar2._4_4_ = -(uint)(key == (trie_key)0x0);
  auVar2._8_4_ = -(uint)(value == (trie_value)0x0);
  auVar2._12_4_ = -(uint)(args == (trie_cb_iterate_args)0x0);
  iVar1 = movmskps(in_EAX,auVar2);
  if (iVar1 == 0) {
    vector_clear(*(vector *)((long)args + 8));
    iVar1 = trie_prefixes(t,key,*(vector *)((long)args + 8));
    if (iVar1 == 0) {
      iVar1 = trie_insert(*args,*(vector *)((long)args + 8),value);
      return iVar1;
    }
  }
  return 1;
}

Assistant:

int trie_node_append_cb_iterator(trie t, trie_key key, trie_value value, trie_cb_iterate_args args)
{
	if (t != NULL && key != NULL && value != NULL && args != NULL)
	{
		trie_node_append_iterator_args iterator_args = args;

		vector_clear(iterator_args->prefixes);

		if (trie_prefixes(t, key, iterator_args->prefixes) == 0)
		{
			return trie_insert(iterator_args->dest, iterator_args->prefixes, value);
		}
	}

	return 1;
}